

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O3

void GetSideShapeFunction<pztopology::TPZTriangle>
               (int side,TPZVec<double> *qsiSide,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  MElementType elType;
  ostream *poVar3;
  stringstream sout;
  string local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [47];
  
  elType = pztopology::TPZTriangle::Type(side);
  switch(elType) {
  case EPoint:
    pztopology::TPZPoint::TShape<double>(qsiSide,phi,dphi);
    return;
  case EOned:
    pztopology::TPZLine::TShape<double>(qsiSide,phi,dphi);
    return;
  case ETriangle:
    pztopology::TPZTriangle::TShape<double>(qsiSide,phi,dphi);
    return;
  case EQuadrilateral:
    pztopology::TPZQuadrilateral::TShape<double>(qsiSide,phi,dphi);
    return;
  case ETetraedro:
    pztopology::TPZTetrahedron::TShape<double>(qsiSide,phi,dphi);
    return;
  case EPiramide:
    pztopology::TPZPyramid::TShape<double>(qsiSide,phi,dphi);
    return;
  case EPrisma:
    pztopology::TPZPrism::TShape<double>(qsiSide,phi,dphi);
    return;
  case ECube:
    pztopology::TPZCube::TShape<double>(qsiSide,phi,dphi);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "Could not find associated shape function to the side. Details are as follows:",0x4d);
  cVar2 = (char)(ostream *)local_1a0;
  std::ios::widen((char)*(undefined8 *)(local_1a0[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Element is of type ",0x13);
  paVar1 = &local_1d0.field_2;
  local_1d0.field_2._M_allocated_capacity = 0x6c676e6169725445;
  local_1d0.field_2._8_2_ = 0x65;
  local_1d0._M_string_length = 9;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,paVar1->_M_local_buf,9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Side\t",5);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,side);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is of type\t",0xc);
  MElementType_Name_abi_cxx11_(&local_1d0,elType);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  poVar3 = (ostream *)std::ostream::flush();
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pzgeom_utility.h"
             ,0x10c);
}

Assistant:

inline void GetSideShapeFunction(int side, TPZVec<REAL> &qsiSide, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi ){
    MElementType  sideType = Topology::Type(side);
#ifdef PZDEBUG
    std::stringstream sout;
    REAL tol = pztopology::GetTolerance();
    if(!IsInSideParametricDomain<Topology>(side,qsiSide,tol)){
        sout<<"The method expects the coordinates in the side's parametric domain. Exiting..."<<std::endl;
        DebugStop();
    }
#endif
    switch (sideType){
        case EPoint:
            return pzgeom::TPZGeoPoint::TShape(qsiSide,phi,dphi);
        case EOned:
            return pzgeom::TPZGeoLinear::TShape(qsiSide,phi,dphi);
        case ETriangle:
            return pzgeom::TPZGeoTriangle::TShape(qsiSide,phi,dphi);
        case EQuadrilateral:
            return pzgeom::TPZGeoQuad::TShape(qsiSide,phi,dphi);
        case ETetraedro:
            return pzgeom::TPZGeoTetrahedra::TShape(qsiSide,phi,dphi);
        case EPiramide:
            return pzgeom::TPZGeoPyramid::TShape(qsiSide,phi,dphi);
        case EPrisma:
            return pzgeom::TPZGeoPrism::TShape(qsiSide,phi,dphi);
        case ECube:
            return pzgeom::TPZGeoCube::TShape(qsiSide,phi,dphi);
        default:{
            std::stringstream sout;
            sout<<"Could not find associated shape function to the side. Details are as follows:"<<std::endl;
            sout<<"Element is of type "<<MElementType_Name(Topology::Type())<<std::endl;
            sout<<"Side\t"<<side<<" is of type\t"<< MElementType_Name(sideType)<<std::endl;
            PZError<<std::endl<<sout.str()<<std::endl;
            DebugStop();
        }
    }
}